

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_copy.cpp
# Opt level: O3

void __thiscall
duckdb::Transformer::ParseGenericOptionListEntry
          (Transformer *this,case_insensitive_map_t<vector<Value>_> *result_options,string *name,
          PGNode *arg)

{
  PGNodeTag PVar1;
  pointer pcVar2;
  bool bVar3;
  iterator iVar4;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar5;
  mapped_type *pmVar6;
  type expr;
  pointer pCVar7;
  ParserException *pPVar8;
  pointer pPVar9;
  pointer *__ptr;
  long *plVar10;
  PGValue val;
  optional_ptr<duckdb_libpgquery::PGResTarget,_true> target;
  optional_ptr<duckdb_libpgquery::PGList,_true> column_list;
  Value value;
  optional_ptr<duckdb::Transformer,_true> local_f8;
  optional_ptr<duckdb_libpgquery::PGFuncCall,_true> local_f0;
  string local_e8;
  Value local_c8;
  LogicalType local_88;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&result_options->_M_h,name);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pPVar8 = (ParserException *)__cxa_allocate_exception(0x10);
    local_c8.type_._0_8_ =
         &local_c8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Unexpected duplicate option \"%s\"","");
    local_70._0_8_ = local_70 + 0x10;
    pcVar2 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + name->_M_string_length);
    ParserException::ParserException<std::__cxx11::string>
              (pPVar8,(string *)&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    __cxa_throw(pPVar8,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (arg == (PGNode *)0x0) {
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)result_options,name);
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (pmVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_c8.type_._0_8_ =
         (pmVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pmVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pmVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pmVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pmVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e8);
  }
  else {
    PVar1 = arg->type;
    if (PVar1 == T_PGAStar) {
      pvVar5 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
               ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)result_options,name);
      Value::Value(&local_c8,anon_var_dwarf_64384ba + 8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (pvVar5,&local_c8);
      Value::~Value(&local_c8);
    }
    else {
      if (PVar1 == T_PGFuncCall) {
        local_f0.ptr = (PGFuncCall *)arg;
        optional_ptr<duckdb_libpgquery::PGFuncCall,_true>::CheckValid(&local_f0);
        TransformFuncCall((Transformer *)&local_f8,(PGFuncCall *)this);
        LogicalType::LogicalType(&local_88,SQLNULL);
        Value::Value(&local_c8,&local_88);
        LogicalType::~LogicalType(&local_88);
        expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&local_f8);
        bVar3 = ConstructConstantFromExpression(expr,&local_c8);
        if (!bVar3) {
          pPVar8 = (ParserException *)__cxa_allocate_exception(0x10);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Unsupported expression in option list: %s","");
          pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_f8);
          (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar9);
          ParserException::ParserException<std::__cxx11::string>(pPVar8,&local_e8,&local_50);
          __cxa_throw(pPVar8,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar5 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)result_options,name);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  (pvVar5,&local_c8);
        Value::~Value(&local_c8);
        local_e8._M_dataplus._M_p = (pointer)local_f8.ptr;
      }
      else {
        if (PVar1 == T_PGList) {
          local_e8._M_dataplus._M_p = (pointer)arg;
          optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&local_e8);
          plVar10 = *(long **)(local_e8._M_dataplus._M_p + 8);
          if (plVar10 == (long *)0x0) {
            return;
          }
          do {
            local_f0.ptr = (PGFuncCall *)*plVar10;
            pvVar5 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                     ::std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)result_options,name);
            optional_ptr<duckdb_libpgquery::PGResTarget,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)&local_f0);
            Value::Value(&local_c8,(char *)(local_f0.ptr)->funcname);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>(pvVar5,&local_c8);
            Value::~Value(&local_c8);
            plVar10 = (long *)plVar10[1];
          } while (plVar10 != (long *)0x0);
          return;
        }
        local_c8.type_._0_8_ = arg;
        pvVar5 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)result_options,name);
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_c8);
        val.val.ival._0_4_ = *(PGNodeTag *)local_c8.type_._0_8_;
        val._0_8_ = this;
        val.val.ival._4_4_ = 0;
        TransformValue((Transformer *)&local_e8,val);
        pCVar7 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                               *)&local_e8);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                  (pvVar5,&pCVar7->value);
      }
      if ((Transformer *)local_e8._M_dataplus._M_p != (Transformer *)0x0) {
        (*(code *)((((Transformer *)local_e8._M_dataplus._M_p)->parent).ptr)->options)();
      }
    }
  }
  return;
}

Assistant:

void Transformer::ParseGenericOptionListEntry(case_insensitive_map_t<vector<Value>> &result_options, string &name,
                                              duckdb_libpgquery::PGNode *arg) {
	// otherwise
	if (result_options.find(name) != result_options.end()) {
		throw ParserException("Unexpected duplicate option \"%s\"", name);
	}
	if (!arg) {
		result_options[name] = vector<Value>();
		return;
	}
	switch (arg->type) {
	case duckdb_libpgquery::T_PGList: {
		auto column_list = PGPointerCast<duckdb_libpgquery::PGList>(arg);
		for (auto c = column_list->head; c != nullptr; c = lnext(c)) {
			auto target = PGPointerCast<duckdb_libpgquery::PGResTarget>(c->data.ptr_value);
			result_options[name].push_back(Value(target->name));
		}
		break;
	}
	case duckdb_libpgquery::T_PGAStar:
		result_options[name].push_back(Value("*"));
		break;
	case duckdb_libpgquery::T_PGFuncCall: {
		auto func_call = PGPointerCast<duckdb_libpgquery::PGFuncCall>(arg);
		auto func_expr = TransformFuncCall(*func_call);

		Value value;
		if (!Transformer::ConstructConstantFromExpression(*func_expr, value)) {
			throw ParserException("Unsupported expression in option list: %s", func_expr->ToString());
		}
		result_options[name].push_back(std::move(value));
		break;
	}
	default: {
		auto val = PGPointerCast<duckdb_libpgquery::PGValue>(arg);
		result_options[name].push_back(TransformValue(*val)->value);
		break;
	}
	}
}